

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

bool absl::lts_20250127::container_internal::AreItersFromSameContainer
               (ctrl_t *ctrl_a,ctrl_t *ctrl_b,void **slot_a,void **slot_b)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  bool bVar3;
  ctrl_t *pcVar4;
  
  bVar3 = true;
  if (ctrl_b != (ctrl_t *)0x0 && ctrl_a != (ctrl_t *)0x0) {
    if ((ctrl_b == kSooControl) == (ctrl_a == kSooControl)) {
      pcVar1 = (ctrl_t *)*slot_a;
      pcVar2 = (ctrl_t *)*slot_b;
      if (ctrl_a == kSooControl) {
        return pcVar1 == pcVar2;
      }
      pcVar4 = pcVar2;
      if (ctrl_b < ctrl_a) {
        pcVar4 = pcVar1;
        ctrl_b = ctrl_a;
        pcVar1 = pcVar2;
      }
      return pcVar1 <= pcVar4 && ctrl_b < pcVar1;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool AreItersFromSameContainer(const ctrl_t* ctrl_a,
                                      const ctrl_t* ctrl_b,
                                      const void* const& slot_a,
                                      const void* const& slot_b) {
  // If either control byte is null, then we can't tell.
  if (ctrl_a == nullptr || ctrl_b == nullptr) return true;
  const bool a_is_soo = IsSooControl(ctrl_a);
  if (a_is_soo != IsSooControl(ctrl_b)) return false;
  if (a_is_soo) return slot_a == slot_b;

  const void* low_slot = slot_a;
  const void* hi_slot = slot_b;
  if (ctrl_a > ctrl_b) {
    std::swap(ctrl_a, ctrl_b);
    std::swap(low_slot, hi_slot);
  }
  return ctrl_b < low_slot && low_slot <= hi_slot;
}